

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_attack_aux_dragon(wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ,wchar_t selection)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar4 = L'\0';
  wVar3 = L'\0';
  if (((borg.trait[0x70] == 0) && (wVar3 = wVar4, borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)
     ) {
    if ((borg_simulate) && (uVar2 = Rand_div(100), (int)uVar2 < 2)) {
      return L'\0';
    }
    if (((borg_items[(ulong)z_info->pack_size + 6].art_idx == '\0') &&
        (_Var1 = borg_equips_dragon(sval), _Var1)) &&
       (wVar3 = borg_launch_arc(rad,dam,typ,(uint)z_info->max_range), borg_simulate == false)) {
      borg_activate_dragon(sval);
      borg_keypress(0x35);
      successful_target = L'\xffffffff';
      if (selection != L'\xffffffff') {
        borg_keypress(selection + L'b');
      }
    }
  }
  return wVar3;
}

Assistant:

static int borg_attack_aux_dragon(
    int sval, int rad, int dam, int typ, int selection)
{
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* Randart dragon armors do not activate for breath */
    if (borg_items[INVEN_BODY].art_idx)
        return 0;

    /* Look for that scale mail and charged*/
    if (!borg_equips_dragon(sval))
        return 0;

    /* Choose optimal location */
    b_n = borg_launch_arc(rad, dam, typ, z_info->max_range);

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Activate the scale mail */
    (void)borg_activate_dragon(sval);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /*  select the correct effect */
    if (selection != -1)
        borg_keypress('b' + selection);

    /* Value */
    return b_n;
}